

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asio_service.cxx
# Opt level: O0

uint32_t __thiscall nuraft::asio_service::get_active_workers(asio_service *this)

{
  long lVar1;
  long in_RDI;
  memory_order __b;
  
  lVar1 = *(long *)(in_RDI + 0x10);
  std::operator&(memory_order_seq_cst,__memory_order_mask);
  return *(uint32_t *)(lVar1 + 0x148);
}

Assistant:

uint32_t asio_service::get_active_workers() {
    return impl_->num_active_workers_.load();
}